

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O0

QString * __thiscall
DebugDirEntryWrapper::getFieldName
          (QString *__return_storage_ptr__,DebugDirEntryWrapper *this,size_t fieldId)

{
  bool bVar1;
  char *local_48;
  size_t fieldId_local;
  DebugDirEntryWrapper *this_local;
  
  switch(fieldId) {
  case 0:
    QString::QString(__return_storage_ptr__,"Characteristics");
    break;
  case 1:
    if ((this->dbgRootDir == (DebugDirWrapper *)0x0) ||
       (bVar1 = DebugDirWrapper::isRepro(this->dbgRootDir), !bVar1)) {
      local_48 = "TimeDateStamp";
    }
    else {
      local_48 = "ReproChecksum";
    }
    QString::QString(__return_storage_ptr__,local_48);
    break;
  case 2:
    QString::QString(__return_storage_ptr__,"MajorVersion");
    break;
  case 3:
    QString::QString(__return_storage_ptr__,"MinorVersion");
    break;
  case 4:
    QString::QString(__return_storage_ptr__,"Type");
    break;
  case 5:
    QString::QString(__return_storage_ptr__,"SizeOfData");
    break;
  case 6:
    QString::QString(__return_storage_ptr__,"AddressOfRawData");
    break;
  case 7:
    QString::QString(__return_storage_ptr__,"PointerToRawData");
    break;
  default:
    (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
      super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xe])(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QString DebugDirEntryWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case CHARACTERISTIC: return "Characteristics";
        case TIMESTAMP: return (dbgRootDir && dbgRootDir->isRepro()) ? "ReproChecksum" :"TimeDateStamp";
        case MAJOR_VER: return "MajorVersion";
        case MINOR_VER: return "MinorVersion";
        case TYPE: return "Type";
        case DATA_SIZE: return "SizeOfData";
        case RAW_DATA_ADDR: return "AddressOfRawData";
        case RAW_DATA_PTR: return "PointerToRawData";
    }
    return getName();
}